

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall miniros::TransportTCP::setNoDelay(TransportTCP *this,bool nodelay)

{
  void *logger_handle;
  undefined8 uVar1;
  byte in_SIL;
  char *in_RDI;
  bool enabled;
  int result;
  int flag;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  LogLocation *in_stack_ffffffffffffff80;
  Level in_stack_ffffffffffffff94;
  Level LVar2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  LogLocation *loc;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  LogLocation local_39 [2];
  int local_14;
  uint local_10;
  byte local_9;
  
  LVar2 = (Level)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_9 = in_SIL & 1;
  local_10 = (uint)(local_9 != 0);
  local_14 = setsockopt(*(int *)(in_RDI + 0x98),6,1,&local_10,4);
  if (local_14 < 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((setNoDelay::loc.initialized_ ^ 0xffU) & 1) != 0) {
      loc = local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,
                 (allocator<char> *)loc);
      console::initializeLogLocation
                (loc,(string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff94);
      std::__cxx11::string::~string((string *)&local_39[0].logger_enabled_);
      std::allocator<char>::~allocator((allocator<char> *)local_39);
    }
    if (setNoDelay::loc.level_ != Error) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),LVar2)
      ;
      console::checkLogLocationEnabled(in_stack_ffffffffffffff80);
    }
    logger_handle = setNoDelay::loc.logger_;
    if ((setNoDelay::loc.logger_enabled_ & 1U) != 0) {
      uVar3 = *(undefined4 *)(in_RDI + 0x98);
      LVar2 = setNoDelay::loc.level_;
      uVar1 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0xb0,"void miniros::TransportTCP::setNoDelay(bool)",
                     "setsockopt failed to set TCP_NODELAY on socket [%d] [%s]",uVar3,uVar1);
    }
  }
  return;
}

Assistant:

void TransportTCP::setNoDelay(bool nodelay)
{
  int flag = nodelay ? 1 : 0;
  int result = setsockopt(sock_, IPPROTO_TCP, TCP_NODELAY, (char *) &flag, sizeof(int));
  if (result < 0)
  {
    MINIROS_ERROR("setsockopt failed to set TCP_NODELAY on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
  }
}